

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void fs_print_error(string_view path,string_view fname)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  string_view fname_local;
  string_view path_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: Ffilesystem:");
  pbVar2 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,fname);
  poVar1 = std::operator<<((ostream *)pbVar2,"(");
  pbVar2 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,path);
  std::operator<<((ostream *)pbVar2,")  ");
  fs_emit_error();
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void fs_print_error(std::string_view path, std::string_view fname)
{

  std::cerr << "ERROR: Ffilesystem:" << fname << "(" << path << ")  ";

  fs_emit_error();

  std::cerr << std::endl;
}